

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  char *pcVar1;
  TransformPromiseNodeBase *this;
  PromiseNode *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  _func_int **pp_Var3;
  _func_int **count;
  Promise<void> PVar4;
  Array<char> buffer;
  Promise<unsigned_long> promise;
  Own<kj::_::PromiseNode> intermediate;
  Array<char> local_68;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  pp_Var3 = (_func_int **)expected.content.ptr;
  count = (_func_int **)((long)&in_RCX[-1]._vptr_PromiseNode + 7);
  if (count == (_func_int **)0x0) {
    Promise<void>::Promise((Promise<void> *)in);
    pPVar2 = extraout_RDX_00;
  }
  else {
    pcVar1 = _::HeapArrayDisposer::allocate<char>((size_t)count);
    buffer.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    buffer.ptr = pcVar1;
    buffer.size_ = (size_t)count;
    (**(code **)(*pp_Var3 + 8))(&promise,pp_Var3,pcVar1,1,count);
    local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    buffer.ptr = (char *)0x0;
    buffer.size_ = 0;
    local_68.ptr = pcVar1;
    local_68.size_ = (size_t)count;
    this = (TransformPromiseNodeBase *)operator_new(0x58);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(Own<kj::_::PromiseNode> *)&promise,
               CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>
               ::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004235d8;
    this[1].super_PromiseNode._vptr_PromiseNode = pp_Var3;
    this[1].dependency.disposer = (Disposer *)expected.content.size_;
    this[1].dependency.ptr = in_RCX;
    this[1].continuationTracePtr = local_68.ptr;
    this[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_68.size_;
    this[2].dependency.disposer = (Disposer *)local_68.disposer;
    local_68.ptr = (char *)0x0;
    local_68.size_ = 0;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,unsigned_long,kj::CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this;
    _::maybeChain<void>(&local_50,(Promise<void> *)&intermediate);
    pPVar2 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    in->_vptr_AsyncInputStream = (_func_int **)local_50.disposer;
    in[1]._vptr_AsyncInputStream = (_func_int **)pPVar2;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Array<char>::~Array(&local_68);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
    Array<char>::~Array(&buffer);
    pPVar2 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar2;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)in;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then(kj::mvCapture(buffer, [&in,expected](kj::Array<char> buffer, size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.slice(0, amount);
    if (memcmp(actual.begin(), expected.begin(), actual.size()) != 0) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  }));
}